

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O1

Byte * z7_BranchConv_ARMT_Dec(Byte *data,SizeT size,UInt32 pc)

{
  int iVar1;
  ushort *puVar2;
  ushort *puVar3;
  ushort *puVar4;
  ushort *puVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  
  if (2 < (size & 0xfffffffffffffffe)) {
    puVar3 = (ushort *)(data + ((size & 0xfffffffffffffffe) - 2));
    iVar1 = (int)data;
    puVar5 = (ushort *)data;
    do {
      bVar6 = *(byte *)((long)data + 1);
      puVar4 = puVar5;
      do {
        iVar8 = 1;
        puVar2 = (ushort *)data;
        puVar5 = (ushort *)data;
        if (data < puVar3) {
          puVar2 = (ushort *)((long)data + 2);
          if (((bVar6 ^ 8) & *(byte *)((long)data + 3)) < 0xf8) {
            puVar5 = puVar2;
            if (puVar2 < puVar3) {
              bVar6 = *(byte *)((long)data + 5);
              puVar2 = (ushort *)((long)data + 4);
              iVar8 = (uint)(0xf7 < ((*(byte *)((long)data + 3) ^ 8) & bVar6)) << 2;
              puVar5 = puVar4;
            }
          }
          else {
            iVar8 = 4;
            puVar5 = puVar4;
          }
        }
        data = (Byte *)puVar2;
        puVar4 = puVar5;
      } while (iVar8 == 0);
      if (iVar8 != 4) {
        return (Byte *)puVar5;
      }
      data = (Byte *)(puVar2 + 1);
      uVar7 = ((uint)puVar2[-1] * 0x800 - ((pc - iVar1) + (int)data >> 1)) + (*puVar2 & 0x7ff);
      puVar2[-1] = (ushort)(uVar7 >> 0xb) & 0x7ff | 0xf000;
      *puVar2 = (ushort)uVar7 | 0xf800;
    } while (data < puVar3);
  }
  return data;
}

Assistant:

Z7_BRANCH_FUNCS_IMP(BranchConv_ARMT)


// #define BR_IA64_NO_INLINE

Z7_BRANCH_FUNC_MAIN(BranchConv_IA64)
{
  // Byte *p = data;
  const Byte *lim;
  size &= ~(SizeT)15;
  lim = p + size;
  pc -= 1 << 4;
  pc >>= 4 - 1;
  // pc -= 1 << 1;
  
  for (;;)
  {
    unsigned m;
    for (;;)
    {
      if Z7_UNLIKELY(p == lim)
        return p;
      m = (unsigned)((UInt32)0x334b0000 >> (*p & 0x1e));
      p += 16;
      pc += 1 << 1;
      if (m &= 3)
        break;
    }
    {
      p += (ptrdiff_t)m * 5 - 20; // negative value is expected here.
      do
      {
        const UInt32 t =
          #if defined(MY_CPU_X86_OR_AMD64)
            // we use 32-bit load here to reduce code size on x86:
            GetUi32(p);
          #else
            GetUi16(p);
          #endif
        UInt32 z = GetUi32(p + 1) >> m;
        p += 5;
        if (((t >> m) & (0x70 << 1)) == 0
            && ((z - (0x5000000 << 1)) & (0xf000000 << 1)) == 0)
        {
          UInt32 v = (UInt32)((0x8fffff << 1) | 1) & z;
          z ^= v;
        #ifdef BR_IA64_NO_INLINE
          v |= (v & ((UInt32)1 << (23 + 1))) >> 3;
          {
            UInt32 c = pc;
            BR_CONVERT_VAL(v, c)
          }
          v &= (0x1fffff << 1) | 1;
        #else
          {
            if (encoding)
            {
              // pc &= ~(0xc00000 << 1); // we just need to clear at least 2 bits
              pc &= (0x1fffff << 1) | 1;
              v += pc;
            }
            else
            {
              // pc |= 0xc00000 << 1; // we need to set at least 2 bits
              pc |= ~(UInt32)((0x1fffff << 1) | 1);
              v -= pc;
            }
          }
          v &= ~(UInt32)(0x600000 << 1);
        #endif
          v += (0x700000 << 1);
          v &= (0x8fffff << 1) | 1;
          z |= v;
          z <<= m;
          SetUi32(p + 1 - 5, z)
        }
        m++;
      }
      while (m &= 3); // while (m < 4);
    }
  }
}